

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::SetCursorPos(ImVec2 *local_pos)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  IVar2.x = (*local_pos).x + ((pIVar1->Pos).x - (pIVar1->Scroll).x);
  IVar2.y = (*local_pos).y + ((pIVar1->Pos).y - (pIVar1->Scroll).y);
  (pIVar1->DC).CursorPos = IVar2;
  (pIVar1->DC).IsSetPos = true;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }